

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::scaleModel(HModel *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  HModel *in_RDI;
  double dVar5;
  double dVar6;
  int row;
  int col;
  int iRow_4;
  int iCol_4;
  int iRow_3;
  int iCol_3;
  int k_3;
  int iCol_2;
  int iRow_2;
  int iCol_1;
  double ln2;
  int iRow_1;
  double value_2;
  int iRow;
  int k_2;
  double value_1;
  int k_1;
  double myCost;
  double sense_col_cost_1;
  double colMax;
  double colMin;
  int iCol;
  int search_count;
  vector<double,_std::allocator<double>_> rowMax;
  vector<double,_std::allocator<double>_> rowMin;
  bool doCost;
  double sense_col_cost;
  int i;
  double minc;
  double value;
  int AnX;
  int k;
  double max0;
  double min0;
  double inf;
  value_type in_stack_fffffffffffffcc8;
  int iVar7;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  allocator_type *in_stack_fffffffffffffcd8;
  value_type vVar8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  size_type in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  double local_2f0;
  double local_2e0;
  double local_2d0;
  double local_2c0;
  double local_2b0;
  double local_2a0;
  double local_290;
  double local_280;
  double local_270;
  double local_260;
  double local_248;
  double local_238;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_10c;
  double local_108;
  value_type local_100;
  int local_fc;
  double local_f8;
  int local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  int local_c4;
  int local_c0;
  undefined8 local_b8;
  vector<double,_std::allocator<double>_> local_b0 [2];
  vector<double,_std::allocator<double>_> local_80;
  byte local_61;
  double local_60;
  double local_58;
  int local_4c;
  double local_48;
  value_type local_40;
  int local_38;
  int local_34;
  double local_30;
  double local_28 [5];
  
  if (in_RDI->intOption[2] != 0) {
    local_28[3] = 1.0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (size_type)in_stack_fffffffffffffcc8,(value_type_conflict1 *)0x17acd1);
    local_28[2] = 1.0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (size_type)in_stack_fffffffffffffcc8,(value_type_conflict1 *)0x17ad08);
    local_28[1] = 1e+200;
    local_28[0] = 1e+200;
    local_30 = 0.0;
    local_34 = 0;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->Astart,(long)in_RDI->numCol);
    local_38 = *pvVar2;
    for (; local_34 < local_38; local_34 = local_34 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Avalue,(long)local_34);
      local_40 = ABS(*pvVar3);
      pdVar4 = std::min<double>(local_28,&local_40);
      local_28[0] = *pdVar4;
      pdVar4 = std::max<double>(&local_30,&local_40);
      local_30 = *pdVar4;
    }
    if ((local_28[0] < 0.2) || (5.0 < local_30)) {
      local_48 = 1e+200;
      for (local_4c = 0; local_4c < in_RDI->numCol; local_4c = local_4c + 1) {
        iVar7 = in_RDI->objSense;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colCost,(long)local_4c);
        local_58 = (double)iVar7 * *pvVar3;
        if ((local_58 != 0.0) || (NAN(local_58))) {
          local_60 = ABS(local_58);
          pdVar4 = std::min<double>(&local_48,&local_60);
          local_48 = *pdVar4;
        }
      }
      local_61 = local_48 < 0.1;
      std::allocator<double>::allocator((allocator<double> *)0x17af69);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffce8,
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcd8);
      std::allocator<double>::~allocator((allocator<double> *)0x17af9d);
      local_b8 = 0x16687e92154ef7ac;
      std::allocator<double>::allocator((allocator<double> *)0x17afdb);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffce8,
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcd8);
      std::allocator<double>::~allocator((allocator<double> *)0x17b00f);
      for (local_c0 = 0; local_c0 < 6; local_c0 = local_c0 + 1) {
        for (local_c4 = 0; local_c4 < in_RDI->numCol; local_c4 = local_c4 + 1) {
          local_d0 = 1e+200;
          local_d8 = 1e-200;
          iVar7 = in_RDI->objSense;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colCost,(long)local_c4);
          local_e0 = (double)iVar7 * *pvVar3;
          local_e8 = ABS(local_e0);
          if (((local_61 & 1) != 0) && ((local_e8 != 0.0 || (NAN(local_e8))))) {
            pdVar4 = std::min<double>(&local_d0,&local_e8);
            local_d0 = *pdVar4;
            pdVar4 = std::max<double>(&local_d8,&local_e8);
            local_d8 = *pdVar4;
          }
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->Astart,(long)local_c4);
          for (local_ec = *pvVar2; iVar7 = local_ec,
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->Astart,(long)(local_c4 + 1)), iVar7 < *pvVar2;
              local_ec = local_ec + 1) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->Avalue,(long)local_ec);
            dVar5 = *pvVar3;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->Aindex,(long)local_ec);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowScale,(long)*pvVar2);
            local_f8 = ABS(dVar5) * *pvVar3;
            pdVar4 = std::min<double>(&local_d0,&local_f8);
            local_d0 = *pdVar4;
            pdVar4 = std::max<double>(&local_d8,&local_f8);
            local_d8 = *pdVar4;
          }
          dVar5 = sqrt(local_d0 * local_d8);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colScale,(long)local_c4);
          *pvVar3 = 1.0 / dVar5;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->Astart,(long)local_c4);
          for (local_fc = *pvVar2; iVar7 = local_fc,
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->Astart,(long)(local_c4 + 1)), iVar7 < *pvVar2;
              local_fc = local_fc + 1) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->Aindex,(long)local_fc);
            local_100 = *pvVar2;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->Avalue,(long)local_fc);
            dVar5 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colScale,(long)local_c4);
            local_108 = ABS(dVar5) * *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_80,(long)local_100);
            pdVar4 = std::min<double>(pvVar3,&local_108);
            dVar5 = *pdVar4;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_80,(long)local_100);
            *pvVar3 = dVar5;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_b0,(long)local_100);
            pdVar4 = std::max<double>(pvVar3,&local_108);
            dVar5 = *pdVar4;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_b0,(long)local_100);
            *pvVar3 = dVar5;
          }
        }
        for (local_10c = 0; local_10c < in_RDI->numRow; local_10c = local_10c + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_80,(long)local_10c);
          dVar5 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_b0,(long)local_10c);
          dVar5 = sqrt(dVar5 * *pvVar3);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->rowScale,(long)local_10c);
          *pvVar3 = 1.0 / dVar5;
        }
        std::vector<double,_std::allocator<double>_>::assign
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (size_type)in_stack_fffffffffffffcc8,(value_type_conflict1 *)0x17b673);
        std::vector<double,_std::allocator<double>_>::assign
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (size_type)in_stack_fffffffffffffcc8,(value_type_conflict1 *)0x17b6ab);
      }
      dVar5 = log(2.0);
      for (local_124 = 0; local_124 < in_RDI->numCol; local_124 = local_124 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colScale,(long)local_124);
        dVar6 = log(*pvVar3);
        dVar6 = floor(dVar6 / dVar5 + 0.5);
        dVar6 = pow(2.0,dVar6);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colScale,(long)local_124);
        *pvVar3 = dVar6;
      }
      for (local_128 = 0; local_128 < in_RDI->numRow; local_128 = local_128 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowScale,(long)local_128);
        dVar6 = log(*pvVar3);
        dVar6 = floor(dVar6 / dVar5 + 0.5);
        dVar6 = pow(2.0,dVar6);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowScale,(long)local_128);
        *pvVar3 = dVar6;
      }
      for (local_12c = 0; local_12c < in_RDI->numCol; local_12c = local_12c + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Astart,(long)local_12c)
        ;
        for (local_130 = *pvVar2;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->Astart,(long)(local_12c + 1)), local_130 < *pvVar2;
            local_130 = local_130 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colScale,(long)local_12c);
          dVar5 = *pvVar3;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->Aindex,(long)local_130);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->rowScale,(long)*pvVar2);
          dVar6 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->Avalue,(long)local_130);
          *pvVar3 = dVar5 * dVar6 * *pvVar3;
        }
      }
      for (local_134 = 0; local_134 < in_RDI->numCol; local_134 = local_134 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colLower,(long)local_134);
        if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colScale,(long)local_134);
          local_238 = *pvVar3;
        }
        else {
          local_238 = 1.0;
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colLower,(long)local_134);
        *pvVar3 = *pvVar3 / local_238;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colUpper,(long)local_134);
        if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colScale,(long)local_134);
          local_248 = *pvVar3;
        }
        else {
          local_248 = 1.0;
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colUpper,(long)local_134);
        *pvVar3 = *pvVar3 / local_248;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colScale,(long)local_134);
        dVar5 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colCost,(long)local_134);
        *pvVar3 = dVar5 * *pvVar3;
      }
      for (local_138 = 0; local_138 < in_RDI->numRow; local_138 = local_138 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowLower,(long)local_138);
        if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->rowScale,(long)local_138);
          local_260 = *pvVar3;
        }
        else {
          local_260 = 1.0;
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowLower,(long)local_138);
        *pvVar3 = local_260 * *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowUpper,(long)local_138);
        if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->rowScale,(long)local_138);
          local_270 = *pvVar3;
        }
        else {
          local_270 = 1.0;
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowUpper,(long)local_138);
        *pvVar3 = local_270 * *pvVar3;
      }
      if ((in_RDI->impliedBoundsPresolve & 1U) != 0) {
        for (local_13c = 0; local_13c < in_RDI->numCol; local_13c = local_13c + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalColLowerImplied,(long)local_13c);
          if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colScale,(long)local_13c);
            local_280 = *pvVar3;
          }
          else {
            local_280 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalColLowerImplied,(long)local_13c);
          *pvVar3 = *pvVar3 / local_280;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalColUpperImplied,(long)local_13c);
          if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colScale,(long)local_13c);
            local_290 = *pvVar3;
          }
          else {
            local_290 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalColUpperImplied,(long)local_13c);
          *pvVar3 = *pvVar3 / local_290;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualColLowerImplied,(long)local_13c);
          if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colScale,(long)local_13c);
            local_2a0 = *pvVar3;
          }
          else {
            local_2a0 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualColLowerImplied,(long)local_13c);
          *pvVar3 = local_2a0 * *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualColUpperImplied,(long)local_13c);
          if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colScale,(long)local_13c);
            local_2b0 = *pvVar3;
          }
          else {
            local_2b0 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualColUpperImplied,(long)local_13c);
          *pvVar3 = local_2b0 * *pvVar3;
        }
        for (local_140 = 0; local_140 < in_RDI->numRow; local_140 = local_140 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalRowLowerImplied,(long)local_140);
          if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowScale,(long)local_140);
            local_2c0 = *pvVar3;
          }
          else {
            local_2c0 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalRowLowerImplied,(long)local_140);
          *pvVar3 = local_2c0 * *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalRowUpperImplied,(long)local_140);
          if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowScale,(long)local_140);
            local_2d0 = *pvVar3;
          }
          else {
            local_2d0 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->primalRowUpperImplied,(long)local_140);
          *pvVar3 = local_2d0 * *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualRowLowerImplied,(long)local_140);
          if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowScale,(long)local_140);
            local_2e0 = *pvVar3;
          }
          else {
            local_2e0 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualRowLowerImplied,(long)local_140);
          *pvVar3 = *pvVar3 / local_2e0;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualRowUpperImplied,(long)local_140);
          if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowScale,(long)local_140);
            local_2f0 = *pvVar3;
          }
          else {
            local_2f0 = 1.0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->dualRowUpperImplied,(long)local_140);
          *pvVar3 = *pvVar3 / local_2f0;
        }
      }
      iVar7 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
      if (in_RDI->mlFg_haveSavedBounds != 0) {
        for (local_144 = 0; local_144 < in_RDI->numCol; local_144 = local_144 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->SvColLower,(long)local_144);
          bVar1 = hsol_isInfinity(in_RDI,-*pvVar3);
          if (!bVar1) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colScale,(long)local_144);
            dVar5 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->SvColLower,(long)local_144);
            *pvVar3 = dVar5 * *pvVar3;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->SvColUpper,(long)local_144);
          bVar1 = hsol_isInfinity(in_RDI,*pvVar3);
          if (!bVar1) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colScale,(long)local_144);
            vVar8 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->SvColUpper,(long)local_144);
            *pvVar3 = vVar8 * *pvVar3;
          }
        }
        for (local_148 = 0; iVar7 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
            local_148 < in_RDI->numRow; local_148 = local_148 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->SvRowLower,(long)local_148);
          in_stack_fffffffffffffce7 = hsol_isInfinity(in_RDI,-*pvVar3);
          if (!(bool)in_stack_fffffffffffffce7) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowScale,(long)local_148);
            vVar8 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->SvRowLower,(long)local_148);
            *pvVar3 = vVar8 * *pvVar3;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->SvRowUpper,(long)local_148);
          in_stack_fffffffffffffcd7 = hsol_isInfinity(in_RDI,*pvVar3);
          if (!(bool)in_stack_fffffffffffffcd7) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowScale,(long)local_148);
            in_stack_fffffffffffffcc8 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->SvRowUpper,(long)local_148);
            *pvVar3 = in_stack_fffffffffffffcc8 * *pvVar3;
          }
        }
      }
      mlFg_Update((HModel *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),iVar7);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    }
  }
  return;
}

Assistant:

void HModel::scaleModel() {
  if (intOption[INTOPT_SCALE_FLAG] == 0) {
    //    printf("NOT SCALING MATRIX\n");
    return;}
  
  // Reset all scaling to 1
  colScale.assign(numCol, 1);
  rowScale.assign(numRow, 1);

    // Find out min0 / max0, skip on if in [0.2, 5]
    const double inf = HSOL_CONST_INF;
    double min0 = inf, max0 = 0;
    for (int k = 0, AnX = Astart[numCol]; k < AnX; k++) {
        double value = fabs(Avalue[k]);
        min0 = min(min0, value);
        max0 = max(max0, value);
    }
    if (min0 >= 0.2 && max0 <= 5)
        return;

    // See if we want to include cost include if min-cost < 0.1
    double minc = inf;
    for (int i = 0; i < numCol; i++) {
      double sense_col_cost = objSense*colCost[i];
      if (sense_col_cost)
	minc = min(minc, fabs(sense_col_cost));
    }
    bool doCost = minc < 0.1;

    // Search up to 6 times
    vector<double> rowMin(numRow, inf);
    vector<double> rowMax(numRow, 1 / inf);
    for (int search_count = 0; search_count < 6; search_count++) {
        // Find column scale, prepare row data
        for (int iCol = 0; iCol < numCol; iCol++) {
            // For column scale (find)
            double colMin = inf;
            double colMax = 1 / inf;
	    double sense_col_cost = objSense*colCost[iCol];
            double myCost = fabs(sense_col_cost);
            if (doCost && myCost != 0)
                colMin = min(colMin, myCost), colMax = max(colMax, myCost);
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                double value = fabs(Avalue[k]) * rowScale[Aindex[k]];
                colMin = min(colMin, value), colMax = max(colMax, value);
            }
            colScale[iCol] = 1 / sqrt(colMin * colMax);

            // For row scale (only collect)
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                int iRow = Aindex[k];
                double value = fabs(Avalue[k]) * colScale[iCol];
                rowMin[iRow] = min(rowMin[iRow], value);
                rowMax[iRow] = max(rowMax[iRow], value);
            }
        }

        // For row scale (find)
        for (int iRow = 0; iRow < numRow; iRow++)
            rowScale[iRow] = 1 / sqrt(rowMin[iRow] * rowMax[iRow]);
        rowMin.assign(numRow, inf);
        rowMax.assign(numRow, 1 / inf);
    }

    // Make it numerical better
    const double ln2 = log(2.0);
    for (int iCol = 0; iCol < numCol; iCol++)
        colScale[iCol] = pow(2.0, floor(log(colScale[iCol]) / ln2 + 0.5));
    for (int iRow = 0; iRow < numRow; iRow++)
        rowScale[iRow] = pow(2.0, floor(log(rowScale[iRow]) / ln2 + 0.5));

    // Apply scaling to matrix and bounds
    for (int iCol = 0; iCol < numCol; iCol++)
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
            Avalue[k] *= (colScale[iCol] * rowScale[Aindex[k]]);

    for (int iCol = 0; iCol < numCol; iCol++) {
        colLower[iCol] /= colLower[iCol] == -inf ? 1 : colScale[iCol];
        colUpper[iCol] /= colUpper[iCol] == +inf ? 1 : colScale[iCol];
        colCost[iCol] *= colScale[iCol];
    }
    for (int iRow = 0; iRow < numRow; iRow++) {
        rowLower[iRow] *= rowLower[iRow] == -inf ? 1 : rowScale[iRow];
        rowUpper[iRow] *= rowUpper[iRow] == +inf ? 1 : rowScale[iRow];
    }
	if (impliedBoundsPresolve) {
		for (int iCol = 0; iCol < numCol; iCol++) {
			primalColLowerImplied[iCol] /= primalColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			primalColUpperImplied[iCol] /= primalColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
			dualColLowerImplied[iCol] *= dualColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			dualColUpperImplied[iCol] *= dualColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
		}
		for (int iRow = 0; iRow < numRow; iRow++) {
			primalRowLowerImplied[iRow] *= primalRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			primalRowUpperImplied[iRow] *= primalRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
			dualRowLowerImplied[iRow] /= dualRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			dualRowUpperImplied[iRow] /= dualRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
		}
	}

	if (mlFg_haveSavedBounds) {
	  //Model has saved bounds which must also be scaled so they are consistent when recovered
	  for (int col = 0; col < numCol; col++) {
	    if (!hsol_isInfinity(-SvColLower[col])) SvColLower[col] *= colScale[col];
	    if (!hsol_isInfinity( SvColUpper[col])) SvColUpper[col] *= colScale[col];
	  }
	  for (int row = 0; row < numRow; row++) {
	    if (!hsol_isInfinity(-SvRowLower[row])) SvRowLower[row] *= rowScale[row];
	    if (!hsol_isInfinity( SvRowUpper[row])) SvRowUpper[row] *= rowScale[row];
	  }
	}
    //Deduce the consequences of scaling the LP
    mlFg_Update(mlFg_action_ScaleLP);
}